

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall Lowerer::LowerBailOnMissingValue(Lowerer *this,Instr *instr,RegOpnd *arrayOpnd)

{
  Func *func_00;
  code *pcVar1;
  RegOpnd *baseOpnd;
  bool bVar2;
  uint32 offset;
  undefined4 *puVar3;
  Opnd *pOVar4;
  IndirOpnd *testSrc1;
  IntConstOpnd *testSrc2;
  undefined1 local_50 [8];
  AutoReuseOpnd autoReuseArrayOpnd;
  LabelInstr *skipBailOutLabel;
  Func *func;
  RegOpnd *local_20;
  RegOpnd *arrayOpnd_local;
  Instr *instr_local;
  Lowerer *this_local;
  
  local_20 = arrayOpnd;
  arrayOpnd_local = (RegOpnd *)instr;
  instr_local = (Instr *)this;
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x33ca,"(instr)","instr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pOVar4 = IR::Instr::GetDst((Instr *)arrayOpnd_local);
  if (pOVar4 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x33cb,"(!instr->GetDst())","!instr->GetDst()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pOVar4 = IR::Instr::GetSrc1((Instr *)arrayOpnd_local);
  if (pOVar4 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x33cc,"(!instr->GetSrc1())","!instr->GetSrc1()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pOVar4 = IR::Instr::GetSrc2((Instr *)arrayOpnd_local);
  if (pOVar4 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x33cd,"(!instr->GetSrc2())","!instr->GetSrc2()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (local_20 == (RegOpnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x33ce,"(arrayOpnd)","arrayOpnd");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  func._6_2_ = (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
               IR::Opnd::GetValueType(&local_20->super_Opnd);
  bVar2 = ValueType::IsArrayOrObjectWithArray((ValueType *)((long)&func + 6));
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x33cf,"(arrayOpnd->GetValueType().IsArrayOrObjectWithArray())",
                       "arrayOpnd->GetValueType().IsArrayOrObjectWithArray()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  func_00 = (Func *)arrayOpnd_local[1].super_Opnd._vptr_Opnd;
  autoReuseArrayOpnd._16_8_ = IR::LabelInstr::New(Label,func_00,false);
  IR::Instr::InsertAfter((Instr *)arrayOpnd_local,(Instr *)autoReuseArrayOpnd._16_8_);
  IR::AutoReuseOpnd::AutoReuseOpnd((AutoReuseOpnd *)local_50,&local_20->super_Opnd,func_00,true);
  baseOpnd = local_20;
  offset = Js::JavascriptArray::GetOffsetOfArrayFlags();
  testSrc1 = IR::IndirOpnd::New(baseOpnd,offset,TyUint8,func_00,false);
  testSrc2 = IR::IntConstOpnd::New(4,TyUint8,func_00,true);
  InsertTestBranch(&testSrc1->super_Opnd,&testSrc2->super_Opnd,BrNeq_A,
                   (LabelInstr *)autoReuseArrayOpnd._16_8_,(Instr *)arrayOpnd_local);
  GenerateBailOut(this,(Instr *)arrayOpnd_local,(BranchInstr *)0x0,(LabelInstr *)0x0,
                  (LabelInstr *)0x0);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_50);
  return;
}

Assistant:

void Lowerer::LowerBailOnMissingValue(IR::Instr *const instr, IR::RegOpnd *const arrayOpnd)
{
    Assert(instr);
    Assert(!instr->GetDst());
    Assert(!instr->GetSrc1());
    Assert(!instr->GetSrc2());
    Assert(arrayOpnd);
    Assert(arrayOpnd->GetValueType().IsArrayOrObjectWithArray());

    Func *const func = instr->m_func;

    // Label to jump to when not bailing out
    const auto skipBailOutLabel = IR::LabelInstr::New(Js::OpCode::Label, func);
    instr->InsertAfter(skipBailOutLabel);

    // Skip bail-out when the array has no missing values
    //
    // test [array + offsetOf(objectArrayOrFlags)], Js::DynamicObjectFlags::HasNoMissingValues
    // jnz  $skipBailOut
    const IR::AutoReuseOpnd autoReuseArrayOpnd(arrayOpnd, func);
    CompileAssert(
        static_cast<Js::DynamicObjectFlags>(static_cast<uint8>(Js::DynamicObjectFlags::HasNoMissingValues)) ==
        Js::DynamicObjectFlags::HasNoMissingValues);
    InsertTestBranch(
        IR::IndirOpnd::New(arrayOpnd, Js::JavascriptArray::GetOffsetOfArrayFlags(), TyUint8, func),
        IR::IntConstOpnd::New(static_cast<uint8>(Js::DynamicObjectFlags::HasNoMissingValues), TyUint8, func, true),
        Js::OpCode::BrNeq_A,
        skipBailOutLabel,
        instr);

    // Generate the bailout helper call. 'instr' will be changed to the CALL into the bailout function, so it can't be used for
    // ordering instructions anymore.
    GenerateBailOut(instr);
}